

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O3

void __thiscall ftxui::SliderBase<long>::~SliderBase(SliderBase<long> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CapturedMouseInterface *pCVar2;
  pointer pcVar3;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__SliderBase_00174c38;
  pCVar2 = (this->captured_mouse_)._M_t.
           super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
           .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl;
  if (pCVar2 != (CapturedMouseInterface *)0x0) {
    (*pCVar2->_vptr_CapturedMouseInterface[1])();
  }
  (this->captured_mouse_)._M_t.
  super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
  .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl =
       (CapturedMouseInterface *)0x0;
  pcVar3 = (this->label_).owned_._M_dataplus._M_p;
  paVar1 = &(this->label_).owned_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  operator_delete(this,0x98);
  return;
}

Assistant:

SliderBase(ConstStringRef label, T* value, T min, T max, T increment)
      : label_(label),
        value_(value),
        min_(min),
        max_(max),
        increment_(increment) {}